

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

size_t __thiscall
kj::BufferedInputStreamWrapper::tryRead
          (BufferedInputStreamWrapper *this,ArrayPtr<unsigned_char> dst,size_t minBytes)

{
  size_t *psVar1;
  size_t sVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  ulong uVar5;
  uchar *__dest;
  undefined4 extraout_var_00;
  
  uVar5 = dst.size_;
  __dest = dst.ptr;
  uVar4 = (this->bufferAvailable).size_;
  if (uVar4 < minBytes) {
    memcpy(__dest,(this->bufferAvailable).ptr,uVar4);
    uVar4 = (this->buffer).size_;
    sVar2 = (this->bufferAvailable).size_;
    uVar5 = uVar5 - sVar2;
    if (uVar4 < uVar5) {
      (this->bufferAvailable).ptr = (uchar *)0x0;
      (this->bufferAvailable).size_ = 0;
      iVar3 = (*this->inner->_vptr_InputStream[2])
                        (this->inner,__dest + sVar2,uVar5,minBytes - sVar2);
      uVar5 = CONCAT44(extraout_var,iVar3);
    }
    else {
      iVar3 = (*this->inner->_vptr_InputStream[2])
                        (this->inner,(this->buffer).ptr,uVar4,minBytes - sVar2);
      uVar4 = CONCAT44(extraout_var_00,iVar3);
      if (uVar4 < uVar5) {
        uVar5 = uVar4;
      }
      memcpy(__dest + sVar2,(this->buffer).ptr,uVar5);
      (this->bufferAvailable).ptr = (this->buffer).ptr + uVar5;
      (this->bufferAvailable).size_ = uVar4 - uVar5;
    }
    uVar5 = uVar5 + sVar2;
  }
  else {
    if (uVar4 < uVar5) {
      uVar5 = uVar4;
    }
    memcpy(__dest,(this->bufferAvailable).ptr,uVar5);
    (this->bufferAvailable).ptr = (this->bufferAvailable).ptr + uVar5;
    psVar1 = &(this->bufferAvailable).size_;
    *psVar1 = *psVar1 - uVar5;
  }
  return uVar5;
}

Assistant:

size_t BufferedInputStreamWrapper::tryRead(ArrayPtr<byte> dst, size_t minBytes) {
  size_t maxBytes = dst.size();
  if (minBytes <= bufferAvailable.size()) {
    // Serve from current buffer.
    size_t n = kj::min(bufferAvailable.size(), maxBytes);
    memcpy(dst.begin(), bufferAvailable.begin(), n);
    bufferAvailable = bufferAvailable.slice(n);
    return n;
  } else {
    // Copy current available into destination.
    memcpy(dst.begin(), bufferAvailable.begin(), bufferAvailable.size());
    size_t fromFirstBuffer = bufferAvailable.size();
    dst = dst.slice(fromFirstBuffer);
    minBytes -= fromFirstBuffer;
    maxBytes -= fromFirstBuffer;

    if (maxBytes <= buffer.size()) {
      // Read the next buffer-full.
      size_t n = inner.tryRead(buffer, minBytes);
      size_t fromSecondBuffer = kj::min(n, maxBytes);
      memcpy(dst.begin(), buffer.begin(), fromSecondBuffer);
      bufferAvailable = buffer.slice(fromSecondBuffer, n);
      return fromFirstBuffer + fromSecondBuffer;
    } else {
      // Forward large read to the underlying stream.
      bufferAvailable = nullptr;
      return fromFirstBuffer + inner.tryRead(dst, minBytes);
    }
  }
}